

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::DecimalType::printTo(DecimalType *this,ostream *out)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(out,"DecimalType(");
  poVar1 = std::operator<<(out,"scale=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->scale);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"precision=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->precision);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(out,")");
  return;
}

Assistant:

void DecimalType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DecimalType(";
  out << "scale=" << to_string(scale);
  out << ", " << "precision=" << to_string(precision);
  out << ")";
}